

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void Commands::ReloadMap(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *arguments,Character *from)

{
  string *subject;
  pointer ppMVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  mapped_type *this;
  Map *pMVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 local_50 [32];
  World *world;
  
  iVar2 = (*(from->super_Command_Source)._vptr_Command_Source[4])(from);
  world = (World *)CONCAT44(extraout_var,iVar2);
  pMVar4 = from->map;
  subject = (arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != subject) {
    uVar3 = util::to_int(subject);
    uVar6 = 1;
    if (1 < (int)uVar3) {
      uVar6 = uVar3;
    }
    ppMVar1 = (world->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)(uVar6 - 1) <
        (ulong)((long)(world->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3)) {
      pMVar4 = ppMVar1[uVar6 - 1];
    }
    else {
      local_50._0_8_ = (Map *)(local_50 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Maps","");
      this = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&world->config,(key_type *)local_50);
      iVar2 = util::variant::GetInt(this);
      if ((Map *)local_50._0_8_ != (Map *)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
      }
      if ((int)uVar6 <= iVar2) {
        uVar5 = (long)(world->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(world->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        if (uVar6 <= uVar5) {
          return;
        }
        do {
          pMVar4 = (Map *)operator_new(0xd8);
          Map::Map(pMVar4,(int)uVar5 + 1,world);
          local_50._0_8_ = pMVar4;
          std::vector<Map*,std::allocator<Map*>>::emplace_back<Map*>
                    ((vector<Map*,std::allocator<Map*>> *)&world->maps,(Map **)local_50);
          uVar5 = (long)(world->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(world->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3;
        } while (uVar5 < uVar6);
        return;
      }
    }
  }
  if (pMVar4 != (Map *)0x0) {
    Map::Reload(pMVar4);
  }
  return;
}

Assistant:

void ReloadMap(const std::vector<std::string>& arguments, Character* from)
{
	World* world = from->SourceWorld();
	Map* map = from->map;
	bool isnew = false;

	if (arguments.size() >= 1)
	{
		int mapid = util::to_int(arguments[0]);

		if (mapid < 1)
			mapid = 1;

		if (world->maps.size() > mapid - 1)
		{
			map = world->maps[mapid - 1];
		}
		else if (mapid <= static_cast<int>(world->config["Maps"]))
		{
			isnew = true;

			while (world->maps.size() < mapid)
			{
				int newmapid = world->maps.size() + 1;
				world->maps.push_back(new Map(newmapid, world));
			}
		}
	}

	if (map && !isnew)
	{
		map->Reload();
	}
}